

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Svd.h
# Opt level: O0

double singular::Svd<60,_50>::calculateShift(BidiagonalMatrix *m,int n)

{
  int __x;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double l1_1;
  double l2;
  double l1;
  double f;
  double e;
  double d;
  double rho;
  double g1;
  double b2;
  double b1;
  int n_local;
  BidiagonalMatrix *m_local;
  
  if (n < 2) {
    __assert_fail("n >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kikuomax[P]singular/src/singular/Svd.h"
                  ,0x252,
                  "static double singular::Svd<60, 50>::calculateShift(const BidiagonalMatrix &, int) [M = 60, N = 50]"
                 );
  }
  dVar1 = BidiagonalMatrix::operator()(m,n + -2,n + -2);
  dVar2 = BidiagonalMatrix::operator()(m,n + -1,n + -1);
  dVar3 = BidiagonalMatrix::operator()(m,n + -2,n + -1);
  __x = (int)m;
  dVar3 = dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2;
  dVar1 = dVar3 * dVar3 + -(dVar1 * dVar1 * dVar2 * dVar2 * 4.0);
  d = dVar2;
  if (0.0 <= dVar1) {
    dVar1 = sqrt(dVar1);
    if (dVar3 <= dVar1) {
      d = sqrt((dVar3 + dVar1) * 0.5);
      std::abs(__x);
      std::abs(__x);
      if (extraout_XMM0_Qa_04 < extraout_XMM0_Qa_03) {
        d = -d;
      }
    }
    else {
      dVar4 = sqrt((dVar3 + dVar1) * 0.5);
      d = sqrt((dVar3 - dVar1) * 0.5);
      if (dVar2 < 0.0) {
        std::abs(__x);
        std::abs(__x);
        if (extraout_XMM0_Qa_01 < extraout_XMM0_Qa_02) {
          d = dVar4;
        }
        d = -d;
      }
      else {
        std::abs(__x);
        std::abs(__x);
        if (extraout_XMM0_Qa < extraout_XMM0_Qa_00) {
          d = dVar4;
        }
      }
    }
  }
  return d;
}

Assistant:

static double calculateShift(const BidiagonalMatrix& m, int n) {
			assert(M >= N);
			assert(n >= 2);
			double b1 = m(n - 2, n - 2);
			double b2 = m(n - 1, n - 1);
			double g1 = m(n - 2, n - 1);
			// solves lambda^4 - d*lambda^2 + e = 0
			// where
			//  d = b1^2 + b2^2 + g1^2
			//  e = b1^2 * b2^2
			// chooses lambda (rho) closest to b2
			double rho;
			double d = b1 * b1 + b2 * b2 + g1 * g1;
			double e = b1 * b1 * b2 * b2;
			// lambda^2 = (d +- sqrt(d^2 - 4e)) / 2
			// so, f = d^2 - 4e must be positive
			double f = d * d - 4 * e;
			if (f >= 0) {
				f = sqrt(f);
				// lambda = +-sqrt(d +- f)  (d >= 0, f >= 0)
				// if d > f, both d+f and d-f have real square roots
				// otherwise considers only d+f
				if (d > f) {
					// lets l1 > l2
					double l1 = sqrt((d + f) * 0.5);
					double l2 = sqrt((d - f) * 0.5);
					// if b2 >= 0, chooses a positive shift
					// otherwise chooses a negative shift
					if (b2 >= 0) {
						if (std::abs(b2 - l1) < std::abs(b2 - l2)) {
							rho = l1;
						} else {
							rho = l2;
						}
					} else {
						if (std::abs(b2 + l1) < std::abs(b2 + l2)) {
							rho = -l1;
						} else {
							rho = -l2;
						}
					}
				} else {
					double l1 = sqrt((d + f) * 0.5);
					if (std::abs(b2 - l1) <= std::abs(b2 + l1)) {
						rho = l1;
					} else {
						rho = -l1;
					}
				}
			} else {
				// no solution. chooses b2 as the shift
				rho = b2;
			}
			return rho;
		}